

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O0

int log_map_insert(log_map map,char *key,void *value)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  size_t sVar4;
  long *plVar5;
  void *pvVar6;
  undefined8 *puVar7;
  long in_RDX;
  char *in_RSI;
  long *in_RDI;
  log_map_bucket_conflict buckets;
  log_map_bucket_conflict bucket;
  log_map_bucket_conflict head;
  size_t hash;
  
  sVar4 = log_map_hash_fnv1(in_RSI);
  plVar5 = (long *)(*in_RDI + (sVar4 & in_RDI[2] - 1U) * 0x18);
  plVar2 = plVar5;
  plVar1 = (long *)*plVar5;
  while (plVar1 != (long *)0x0) {
    iVar3 = strcmp((char *)*plVar2,in_RSI);
    if (iVar3 == 0) {
      plVar2[1] = in_RDX;
      return 0;
    }
    plVar2 = (long *)plVar2[2];
    plVar1 = plVar2;
  }
  in_RDI[1] = in_RDI[1] + 1;
  if (*plVar5 == 0) {
    *plVar5 = (long)in_RSI;
    plVar5[1] = in_RDX;
    plVar5[2] = 0;
    return 0;
  }
  if (0xff < (ulong)in_RDI[6]) {
    if ((ulong)in_RDI[5] <= (ulong)in_RDI[4]) {
      return 1;
    }
    pvVar6 = malloc(0x1800);
    if (pvVar6 == (void *)0x0) {
      return 1;
    }
    *(void **)(in_RDI[3] + in_RDI[4] * 8) = pvVar6;
    in_RDI[6] = 0;
    in_RDI[4] = in_RDI[4] + 1;
  }
  puVar7 = (undefined8 *)(*(long *)(in_RDI[3] + (in_RDI[4] + -1) * 8) + in_RDI[6] * 0x18);
  *puVar7 = in_RSI;
  puVar7[1] = in_RDX;
  puVar7[2] = plVar5[2];
  plVar5[2] = (long)puVar7;
  in_RDI[6] = in_RDI[6] + 1;
  return 0;
}

Assistant:

int log_map_insert(log_map map, const char *key, const void *value)
{
	size_t hash = log_map_hash_fnv1(key) & (map->table.size - 1);

	log_map_bucket head = &map->table.data[hash];

	log_map_bucket bucket = head;

	if (head->key != NULL)
	{
		do
		{
			if (strcmp(bucket->key, key) == 0)
			{
				bucket->value = value;

				return 0;
			}

			bucket = bucket->next;

		} while (bucket != NULL);
	}

	++map->table.count;

	if (head->key == NULL)
	{
		head->key = key;
		head->value = value;
		head->next = NULL;

		return 0;
	}

	if (map->block.position >= LOG_MAP_BUCKET_SIZE)
	{
		log_map_bucket buckets = NULL;

		if (map->block.count >= map->block.size)
		{
			return 1;
		}

		buckets = malloc(sizeof(struct log_map_bucket_type) * LOG_MAP_BUCKET_SIZE);

		if (buckets == NULL)
		{
			return 1;
		}

		map->block.data[map->block.count] = buckets;

		map->block.position = 0;

		++map->block.count;
	}

	bucket = map->block.data[map->block.count - 1] + map->block.position;

	bucket->key = key;
	bucket->value = value;
	bucket->next = head->next;
	head->next = bucket;

	++map->block.position;

	return 0;
}